

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void testing::internal::PrintCharTo(char c,int char_code,ostream *os)

{
  ostream *poVar1;
  
  std::operator<<(os,"\'");
  PrintAsWideCharLiteralTo((uint)(byte)c,os);
  std::operator<<(os,"\'");
  if (c != '\0') {
    poVar1 = std::operator<<(os," (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,char_code);
    std::operator<<(poVar1,")");
    return;
  }
  return;
}

Assistant:

void PrintCharTo(char c, int char_code, ostream* os) {
  *os << "'";
  PrintAsCharLiteralTo(c, os);
  *os << "'";
  if (c != '\0')
    *os << " (" << char_code << ")";
}